

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O0

void __thiscall CProjectile::FillInfo(CProjectile *this,CNetObj_Projectile *pProj)

{
  int iVar1;
  int *in_RSI;
  long in_RDI;
  
  iVar1 = round_to_int(*(float *)(in_RDI + 0x30));
  *in_RSI = iVar1;
  iVar1 = round_to_int(*(float *)(in_RDI + 0x34));
  in_RSI[1] = iVar1;
  iVar1 = round_to_int(*(float *)(in_RDI + 0x38) * 100.0);
  in_RSI[2] = iVar1;
  iVar1 = round_to_int(*(float *)(in_RDI + 0x3c) * 100.0);
  in_RSI[3] = iVar1;
  in_RSI[5] = *(int *)(in_RDI + 0x60);
  in_RSI[4] = *(int *)(in_RDI + 0x4c);
  return;
}

Assistant:

void CProjectile::FillInfo(CNetObj_Projectile *pProj)
{
	pProj->m_X = round_to_int(m_Pos.x);
	pProj->m_Y = round_to_int(m_Pos.y);
	pProj->m_VelX = round_to_int(m_Direction.x*100.0f);
	pProj->m_VelY = round_to_int(m_Direction.y*100.0f);
	pProj->m_StartTick = m_StartTick;
	pProj->m_Type = m_Type;
}